

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O3

void raviV_op_setupvalf(lua_State *L,LClosure *cl,TValue *ra,int b)

{
  UpVal *pUVar1;
  Value *pVVar2;
  Value VVar3;
  
  if (ra->tt_ == 0x13) {
    VVar3.n = (lua_Number)(ra->value_).i;
  }
  else {
    if (ra->tt_ != 3) {
      luaG_runerror(L,"upvalue of number type, cannot be set to non number value");
    }
    VVar3 = ra->value_;
  }
  pUVar1 = cl->upvals[b];
  pVVar2 = &pUVar1->v->value_;
  *pVVar2 = VVar3;
  *(undefined2 *)(pVVar2 + 1) = 3;
  if (((short)ra->tt_ < 0) && (pUVar1->v == (TValue *)&pUVar1->u)) {
    luaC_upvalbarrier_(L,(ra->value_).gc);
    return;
  }
  return;
}

Assistant:

void raviV_op_setupvalf(lua_State *L, LClosure *cl, TValue *ra, int b) {
  lua_Number na;
  if (tonumberns(ra, na)) {
    UpVal *uv = cl->upvals[b];
    setfltvalue(uv->v, na);
    luaC_upvalbarrier(L, uv, ra);
  }
  else
    luaG_runerror(L,
                  "upvalue of number type, cannot be set to non number value");
}